

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O1

void bench_get_msurf_descriptor
               (vector<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
                *functions,integral_image *iimage,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points,
               vector<benchmark_data,_std::allocator<benchmark_data>_> *data)

{
  pointer piVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  double *pdVar4;
  double *pdVar5;
  benchmark_data *pbVar6;
  ulong uVar7;
  undefined8 extraout_RDX;
  long lVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  interest_point *unaff_R12;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_ZMM2 [64];
  interest_point ipoint;
  long lStack_1f8;
  double dStack_1f0;
  double dStack_1e8;
  double *pdStack_1e0;
  double *pdStack_1d8;
  double *pdStack_1d0;
  double dStack_1c0;
  benchmark_data *pbStack_1b8;
  double dStack_1b0;
  long lStack_1a8;
  interest_point *piStack_1a0;
  ulong uStack_198;
  vector<interest_point,_std::allocator<interest_point>_> *pvStack_190;
  ulong uStack_188;
  code *pcStack_180;
  uint local_16c;
  vector<benchmark_data,_std::allocator<benchmark_data>_> *local_168;
  uint local_15c;
  vector<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
  *local_158;
  integral_image *local_150;
  interest_point local_144;
  
  if (*(long *)(functions + 8) != *(long *)functions) {
    uVar13 = 0;
    local_168 = data;
    local_158 = functions;
    local_150 = iimage;
    do {
      lVar8 = uVar13 * 0x238;
      local_15c = *(uint *)(*(long *)local_168 + 0x208 + lVar8);
      pbVar6 = (benchmark_data *)(ulong)local_15c;
      local_16c = 5;
      if ((int)local_15c < 5) {
        local_16c = local_15c;
      }
      if (0 < (int)local_15c) {
        uVar12 = (ulong)local_16c;
        uVar10 = 0;
        do {
          piVar1 = (interest_points->
                   super__Vector_base<interest_point,_std::allocator<interest_point>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = ((long)(interest_points->
                         super__Vector_base<interest_point,_std::allocator<interest_point>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2) *
                  -0xed7303b5cc0ed73;
          if (uVar7 < uVar10 || uVar7 - uVar10 == 0) {
            pcVar11 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
            pcStack_180 = perf_get_msurf_descriptor;
            uVar7 = uVar10;
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar10);
            dStack_1f0 = 0.0;
            lStack_1f8 = 100;
            dVar15 = 1.0;
            pbStack_1b8 = pbVar6;
            lStack_1a8 = lVar8;
            piStack_1a0 = unaff_R12;
            uStack_198 = uVar12;
            pvStack_190 = interest_points;
            uStack_188 = uVar13;
            pcStack_180 = (code *)uVar10;
            do {
              lStack_1f8 = (long)(dVar15 * (double)lStack_1f8);
              cpuid_basic_info(0);
              uVar13 = rdtsc();
              for (lVar8 = lStack_1f8; lVar8 != 0; lVar8 = lVar8 + -1) {
                (*(code *)pcVar11)(uVar7,extraout_RDX);
              }
              uVar10 = rdtsc();
              cpuid_basic_info(0);
              auVar14 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                           (((ulong)(uint)-(int)(uVar13 >> 0x20) << 0x20) -
                                           (uVar13 & 0xffffffff)) +
                                           (uVar10 & 0xffffffff) + (uVar10 & 0xffffffff00000000));
              dStack_1f0 = auVar14._0_8_;
              dVar15 = 100000000.0 / dStack_1f0;
            } while (2.0 < dVar15);
            pdStack_1e0 = (double *)0x0;
            pdStack_1d8 = (double *)0x0;
            pdStack_1d0 = (double *)0x0;
            dStack_1b0 = (double)lStack_1f8;
            dStack_1c0 = 0.0;
            lVar8 = 0;
            do {
              cpuid_basic_info(0);
              uVar2 = rdtsc();
              dStack_1e8 = (double)CONCAT44(dStack_1e8._4_4_,(int)uVar2);
              for (lVar9 = lStack_1f8; lVar9 != 0; lVar9 = lVar9 + -1) {
                (*(code *)pcVar11)(uVar7,extraout_RDX);
              }
              uVar13 = rdtsc();
              cpuid_basic_info(0);
              auVar14 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                           (((ulong)(uint)-(int)((ulong)uVar2 >> 0x20) << 0x20) -
                                           ((ulong)dStack_1e8 & 0xffffffff)) +
                                           (uVar13 & 0xffffffff) + (uVar13 & 0xffffffff00000000));
              dStack_1f0 = auVar14._0_8_ / dStack_1b0;
              dStack_1e8 = dStack_1f0;
              if (pdStack_1d8 == pdStack_1d0) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)&pdStack_1e0,
                           (iterator)pdStack_1d8,&dStack_1f0);
              }
              else {
                *pdStack_1d8 = dStack_1f0;
                pdStack_1d8 = pdStack_1d8 + 1;
              }
              pbVar6 = pbStack_1b8;
              pdVar5 = pdStack_1d8;
              pdVar4 = pdStack_1e0;
              dStack_1c0 = dStack_1c0 + dStack_1e8;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 10);
            dVar15 = dStack_1c0 / 10.0;
            lVar8 = *(long *)(pbStack_1b8 + 0x210);
            dStack_1f0 = dVar15;
            if (pdStack_1e0 != pdStack_1d8) {
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (pdStack_1e0,pdStack_1d8,
                         (int)LZCOUNT((long)pdStack_1d8 - (long)pdStack_1e0 >> 3) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (pdVar4,pdVar5);
            }
            auVar16._0_8_ = ((double)lVar8 * 100.0) / dVar15;
            auVar16._8_8_ = 0;
            auVar19._8_8_ = 0x3fdfffffffffffff;
            auVar19._0_8_ = 0x3fdfffffffffffff;
            auVar3._8_8_ = 0x8000000000000000;
            auVar3._0_8_ = 0x8000000000000000;
            auVar14 = vpternlogq_avx512vl(auVar19,auVar16,auVar3,0xf8);
            auVar17._8_8_ = 0;
            auVar17._0_8_ = auVar16._0_8_ + auVar14._0_8_;
            auVar3 = vroundsd_avx(auVar17,auVar17,0xb);
            auVar18._8_8_ = 0;
            auVar18._0_8_ = dStack_1f0;
            auVar14 = vmovhps_avx(auVar18,*pdStack_1e0);
            auVar14 = vcvttpd2uqq_avx512vl(auVar14);
            auVar14 = vpaddq_avx(auVar14,*(undefined1 (*) [16])(pbVar6 + 0x218));
            *(undefined1 (*) [16])(pbVar6 + 0x218) = auVar14;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = pdStack_1d8[-1];
            lVar8 = vcvttsd2usi_avx512f(auVar14);
            *(long *)(pbVar6 + 0x228) = *(long *)(pbVar6 + 0x228) + lVar8;
            *(double *)(pbVar6 + 0x230) = auVar3._0_8_ / 100.0 + *(double *)(pbVar6 + 0x230);
            operator_delete(pdStack_1e0,(long)pdStack_1d0 - (long)pdStack_1e0);
            return;
          }
          unaff_R12 = &local_144;
          pcStack_180 = (code *)0x10ac6b;
          memcpy(unaff_R12,piVar1 + uVar10,0x114);
          pbVar6 = (benchmark_data *)(*(long *)local_168 + lVar8);
          pcStack_180 = (code *)0x10ac8f;
          perf_get_msurf_descriptor
                    (*(_func_void_integral_image_ptr_interest_point_ptr **)
                      (*(long *)local_158 + uVar13 * 8),local_150,unaff_R12,pbVar6);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar12);
      }
      if (local_15c != 0) {
        uVar10 = (ulong)(int)local_16c;
        lVar9 = *(long *)local_168;
        *(ulong *)(lVar9 + 0x218 + lVar8) = *(ulong *)(lVar9 + 0x218 + lVar8) / uVar10;
        *(ulong *)(lVar9 + 0x228 + lVar8) = *(ulong *)(lVar9 + 0x228 + lVar8) / uVar10;
        *(ulong *)(lVar9 + 0x220 + lVar8) = *(ulong *)(lVar9 + 0x220 + lVar8) / uVar10;
        *(double *)(lVar9 + 0x230 + lVar8) =
             *(double *)(lVar9 + 0x230 + lVar8) / (double)(int)local_16c;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)(*(long *)(local_158 + 8) - *(long *)local_158 >> 3));
  }
  return;
}

Assistant:

void bench_get_msurf_descriptor(
    const std::vector<void (*)(struct integral_image *, struct interest_point *)> &functions,
    struct integral_image *iimage, std::vector<struct interest_point> *interest_points,
    std::vector<struct benchmark_data> &data) {
    assert(functions.size() == data.size());

    // Iterating through all functions that should be benchmarked
    for (int j = 0; j < functions.size(); ++j) {
        // Specifies how many times the timing for get_msurf_descriptor will be called. The average will be taken.
        int counter = MIN(5, data[j].num_interest_points);
        for (int i = 0; i < counter; ++i) {
            struct interest_point ipoint = interest_points->at(i);
            perf_get_msurf_descriptor(functions[j], iimage, &ipoint, data[j]);
        }

        // Take the average of the runs.
        if (counter != 0) {
            data[j].avg_cycles /= counter;
            data[j].max_cycles /= counter;
            data[j].min_cycles /= counter;
            data[j].flops_per_cycle /= counter;
        }
    }
}